

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

cbtDbvtNode * removeleaf(cbtDbvt *pdbvt,cbtDbvtNode *leaf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtDbvtNode *pcVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  cbtDbvtNode *pcVar12;
  cbtDbvtNode *pcVar13;
  
  if (pdbvt->m_root == leaf) {
    pdbvt->m_root = (cbtDbvtNode *)0x0;
    pcVar12 = (cbtDbvtNode *)0x0;
  }
  else {
    pcVar12 = leaf->parent;
    pcVar13 = pcVar12->parent;
    pcVar8 = *(cbtDbvtNode **)
              ((long)(&pcVar12->volume + 1) +
              ((ulong)((pcVar12->field_2).childs[1] != leaf) + 1) * 8);
    if (pcVar13 == (cbtDbvtNode *)0x0) {
      pdbvt->m_root = pcVar8;
      pcVar8->parent = (cbtDbvtNode *)0x0;
      cbtAlignedFreeInternal(pdbvt->m_free);
      pdbvt->m_free = pcVar12;
    }
    else {
      *(cbtDbvtNode **)
       ((long)(&pcVar13->volume + 1) + ((ulong)((pcVar13->field_2).childs[1] == pcVar12) + 1) * 8) =
           pcVar8;
      pcVar8->parent = pcVar13;
      cbtAlignedFreeInternal(pdbvt->m_free);
      pdbvt->m_free = pcVar12;
      do {
        if (pcVar13 == (cbtDbvtNode *)0x0) {
          pcVar13 = (cbtDbvtNode *)0x0;
          break;
        }
        fVar1 = (pcVar13->volume).mi.m_floats[0];
        fVar2 = (pcVar13->volume).mi.m_floats[1];
        fVar3 = (pcVar13->volume).mi.m_floats[2];
        fVar4 = (pcVar13->volume).mx.m_floats[0];
        fVar5 = (pcVar13->volume).mx.m_floats[1];
        fVar6 = (pcVar13->volume).mx.m_floats[2];
        pcVar12 = (pcVar13->field_2).childs[0];
        pcVar8 = (pcVar13->field_2).childs[1];
        lVar11 = 4;
        do {
          auVar9 = vminss_avx(ZEXT416(*(uint *)((long)(&(pcVar12->volume).mi + -1) + lVar11 * 4)),
                              ZEXT416(*(uint *)((long)(&(pcVar8->volume).mi + -1) + lVar11 * 4)));
          *(int *)((long)(&(pcVar13->volume).mi + -1) + lVar11 * 4) = auVar9._0_4_;
          auVar9 = vmaxss_avx(ZEXT416((uint)(pcVar12->volume).mi.m_floats[lVar11]),
                              ZEXT416((uint)(pcVar8->volume).mi.m_floats[lVar11]));
          (pcVar13->volume).mi.m_floats[lVar11] = auVar9._0_4_;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 7);
        fVar7 = (pcVar13->volume).mi.m_floats[0];
        if ((((((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) ||
              (fVar1 = (pcVar13->volume).mi.m_floats[1], fVar2 != fVar1)) ||
             ((NAN(fVar2) || NAN(fVar1) ||
              (fVar1 = (pcVar13->volume).mi.m_floats[2], fVar3 != fVar1)))) ||
            ((NAN(fVar3) || NAN(fVar1) ||
             ((fVar1 = (pcVar13->volume).mx.m_floats[0], fVar4 != fVar1 ||
              (NAN(fVar4) || NAN(fVar1))))))) ||
           ((fVar1 = (pcVar13->volume).mx.m_floats[1], fVar5 != fVar1 || (NAN(fVar5) || NAN(fVar1)))
           )) {
LAB_008c6b50:
          pcVar13 = pcVar13->parent;
          bVar10 = true;
        }
        else {
          fVar1 = (pcVar13->volume).mx.m_floats[2];
          if ((fVar6 != fVar1) || (NAN(fVar6) || NAN(fVar1))) goto LAB_008c6b50;
          bVar10 = false;
        }
      } while (bVar10);
      if (pcVar13 != (cbtDbvtNode *)0x0) {
        return pcVar13;
      }
    }
    pcVar12 = pdbvt->m_root;
  }
  return pcVar12;
}

Assistant:

static cbtDbvtNode* removeleaf(cbtDbvt* pdbvt,
							  cbtDbvtNode* leaf)
{
	if (leaf == pdbvt->m_root)
	{
		pdbvt->m_root = 0;
		return (0);
	}
	else
	{
		cbtDbvtNode* parent = leaf->parent;
		cbtDbvtNode* prev = parent->parent;
		cbtDbvtNode* sibling = parent->childs[1 - indexof(leaf)];
		if (prev)
		{
			prev->childs[indexof(parent)] = sibling;
			sibling->parent = prev;
			deletenode(pdbvt, parent);
			while (prev)
			{
				const cbtDbvtVolume pb = prev->volume;
				Merge(prev->childs[0]->volume, prev->childs[1]->volume, prev->volume);
				if (NotEqual(pb, prev->volume))
				{
					prev = prev->parent;
				}
				else
					break;
			}
			return (prev ? prev : pdbvt->m_root);
		}
		else
		{
			pdbvt->m_root = sibling;
			sibling->parent = 0;
			deletenode(pdbvt, parent);
			return (pdbvt->m_root);
		}
	}
}